

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O0

void __thiscall opengv::absolute_pose::modules::Epnp::choose_control_points(Epnp *this)

{
  double dVar1;
  double dVar2;
  Scalar *pSVar3;
  TransposeReturnType this_00;
  long in_RDI;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *this_01;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  PVar7;
  int j_3;
  double k;
  int i_2;
  MatrixXd Ut;
  MatrixXd D;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD;
  MatrixXd PW0tPW0;
  int j_2;
  int i_1;
  MatrixXd PW0;
  int j_1;
  int j;
  int i;
  EigenBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *in_stack_fffffffffffffca8;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *in_stack_fffffffffffffcb0;
  int *in_stack_fffffffffffffcc0;
  int *in_stack_fffffffffffffcc8;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_fffffffffffffcd0;
  undefined4 local_2ec;
  undefined4 local_2dc;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  *(undefined8 *)(in_RDI + 0x60) = 0;
  *(undefined8 *)(in_RDI + 0x58) = 0;
  *(undefined8 *)(in_RDI + 0x50) = 0;
  for (local_c = 0; local_c < *(int *)(in_RDI + 0x4c); local_c = local_c + 1) {
    for (local_10 = 0; local_10 < 3; local_10 = local_10 + 1) {
      *(double *)(in_RDI + 0x50 + (long)local_10 * 8) =
           *(double *)(*(long *)(in_RDI + 0x20) + (long)(local_c * 3 + local_10) * 8) +
           *(double *)(in_RDI + 0x50 + (long)local_10 * 8);
    }
  }
  local_14 = 0;
  while( true ) {
    if (2 < local_14) break;
    *(double *)(in_RDI + 0x50 + (long)local_14 * 8) =
         *(double *)(in_RDI + 0x50 + (long)local_14 * 8) / (double)*(int *)(in_RDI + 0x4c);
    local_14 = local_14 + 1;
  }
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
  for (local_38 = 0; local_38 < *(int *)(in_RDI + 0x4c); local_38 = local_38 + 1) {
    for (local_3c = 0; local_3c < 3; local_3c = local_3c + 1) {
      dVar1 = *(double *)(*(long *)(in_RDI + 0x20) + (long)(local_38 * 3 + local_3c) * 8);
      dVar2 = *(double *)(in_RDI + 0x50 + (long)local_3c * 8);
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          in_stack_fffffffffffffcb0,(Index)in_stack_fffffffffffffca8,0x8d092e);
      *pSVar3 = dVar1 - dVar2;
    }
  }
  this_00 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                      ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                       in_stack_fffffffffffffca8);
  PVar7 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::operator*
                    ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                     in_stack_fffffffffffffcb0,
                     (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                     in_stack_fffffffffffffca8);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffcb0,
             (EigenBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)in_stack_fffffffffffffca8);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            ((JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)this_00.m_matrix,
             PVar7.m_lhs.m_matrix.m_matrix,PVar7.m_rhs._4_4_);
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::singularValues
            (&in_stack_fffffffffffffcb0->
              super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffcb0,
             (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffca8);
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::matrixU
            (&in_stack_fffffffffffffcb0->
              super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffca8);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffcb0,
             in_stack_fffffffffffffca8);
  for (local_2dc = 1; local_2dc < 4; local_2dc = local_2dc + 1) {
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_fffffffffffffcb0,(Index)in_stack_fffffffffffffca8,0x8d0ab8);
    this_01 = (JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)
              sqrt(*pSVar3 / (double)*(int *)(in_RDI + 0x4c));
    for (local_2ec = 0; local_2ec < 3; local_2ec = local_2ec + 1) {
      in_stack_fffffffffffffca8 =
           *(EigenBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> **)
            (in_RDI + 0x50 + (long)local_2ec * 8);
      in_stack_fffffffffffffcb0 = this_01;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)this_01,
                          (Index)in_stack_fffffffffffffca8,0x8d0b2b);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = in_stack_fffffffffffffcb0;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = in_stack_fffffffffffffca8;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *pSVar3;
      auVar4 = vfmadd213sd_fma(auVar4,auVar5,auVar6);
      *(long *)(in_RDI + 0x50 + (long)local_2dc * 0x18 + (long)local_2ec * 8) = auVar4._0_8_;
    }
  }
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x8d0c04);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x8d0c11);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD
            (in_stack_fffffffffffffcb0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x8d0c2b);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x8d0c38);
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::choose_control_points(void)
{
  // Take C0 as the reference points centroid:
  cws[0][0] = cws[0][1] = cws[0][2] = 0;
  for(int i = 0; i < number_of_correspondences; i++)
    for(int j = 0; j < 3; j++)
      cws[0][j] += pws[3 * i + j];

  for(int j = 0; j < 3; j++)
    cws[0][j] /= number_of_correspondences;


  // Take C1, C2, and C3 from PCA on the reference points:
  Eigen::MatrixXd PW0(number_of_correspondences,3);

  for(int i = 0; i < number_of_correspondences; i++)
    for(int j = 0; j < 3; j++)
      PW0(i,j) = pws[3 * i + j] - cws[0][j];

  Eigen::MatrixXd PW0tPW0 = PW0.transpose() * PW0;
  Eigen::JacobiSVD< Eigen::MatrixXd > SVD(
      PW0tPW0,
      Eigen::ComputeFullV | Eigen::ComputeFullU );
  Eigen::MatrixXd D = SVD.singularValues();
  Eigen::MatrixXd Ut = SVD.matrixU().transpose();

  for(int i = 1; i < 4; i++)
  {
    double k = sqrt(D(i - 1,0) / number_of_correspondences);
    for(int j = 0; j < 3; j++)
      cws[i][j] = cws[0][j] + k * Ut((i - 1),j);
  }
}